

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O3

void __thiscall
cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this,VariableIndex *from_where)

{
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *this_00;
  pointer pTVar1;
  uint *puVar2;
  uint uVar3;
  ComputationGraph *pCVar4;
  pointer pTVar5;
  pointer pVVar6;
  pointer ppNVar7;
  Node *pNVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float *pfVar13;
  pointer pVVar14;
  int iVar15;
  difference_type __n;
  pointer pTVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs;
  Dim dim;
  allocator_type local_b1;
  ulong local_b0;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> local_a8;
  vector<bool,_std::allocator<bool>_> local_88;
  vector<bool,_std::allocator<bool>_> local_58;
  
  uVar19 = from_where->t;
  uVar18 = (ulong)uVar19;
  uVar22 = (ulong)(uVar19 + 1);
  pTVar16 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar16 >> 3) *
             -0x71c71c71c71c71c7) < uVar22) {
    __assert_fail("from_where+1 <= nfxs.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/exec.cc"
                  ,0x56,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  pCVar4 = (this->super_ExecutionEngine).cg;
  if ((ulong)((long)(pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) < uVar22) {
    __assert_fail("from_where+1 <= cg.nodes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/exec.cc"
                  ,0x57,"virtual void cnn::SimpleExecutionEngine::backward(VariableIndex)");
  }
  uVar20 = (ulong)pTVar16[uVar18].d.nd;
  iVar15 = 1;
  if (uVar20 != 0) {
    uVar21 = 0;
    do {
      iVar15 = iVar15 * pTVar16[uVar18].d.d[uVar21];
      uVar21 = uVar21 + 1;
    } while (uVar20 != uVar21);
  }
  if (iVar15 * pTVar16[uVar18].d.bd == 1) {
    this_00 = &this->ndEdfs;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::resize(this_00,uVar22);
    dEdfs->used = 0;
    if (uVar22 != 0) {
      pTVar16 = (this_00->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar20 = 0;
      do {
        pTVar5 = (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._0_4_ = pTVar5[uVar20].d.bd;
        pTVar1 = pTVar5 + uVar20;
        puVar2 = pTVar5[uVar20].d.d + 4;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._8_8_ = *(undefined8 *)(puVar2 + 2);
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = *(_Bit_type **)puVar2;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = *(_Bit_type **)(pTVar1->d).d;
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = (pTVar1->d).d[2];
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._12_4_ = (pTVar1->d).d[3];
        uVar9 = *(undefined8 *)pTVar5[uVar20].d.d;
        uVar10 = *(undefined8 *)(pTVar5[uVar20].d.d + 2);
        puVar2 = pTVar5[uVar20].d.d + 4;
        uVar11 = *(undefined8 *)puVar2;
        uVar12 = *(undefined8 *)(puVar2 + 2);
        pTVar16[uVar20].d.bd = pTVar5[uVar20].d.bd;
        puVar2 = pTVar16[uVar20].d.d + 4;
        *(undefined8 *)puVar2 = uVar11;
        *(undefined8 *)(puVar2 + 2) = uVar12;
        *(undefined8 *)pTVar16[uVar20].d.d = uVar9;
        *(undefined8 *)(pTVar16[uVar20].d.d + 2) = uVar10;
        uVar21 = (ulong)local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ >> 0x20;
        iVar15 = 1;
        if (uVar21 != 0) {
          uVar17 = 0;
          do {
            iVar15 = iVar15 * *(int *)((long)&local_88.super__Bvector_base<std::allocator<bool>_>.
                                              _M_impl.super__Bvector_impl_data._M_start.
                                              super__Bit_iterator_base._M_p + uVar17 * 4);
            uVar17 = uVar17 + 1;
          } while (uVar21 != uVar17);
        }
        pfVar13 = (float *)AlignedMemoryPool::allocate
                                     (dEdfs,(ulong)(iVar15 * (uint)local_88.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_end_of_storage) << 2)
        ;
        pTVar16 = (this_00->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pTVar16[uVar20].v = pfVar13;
        if (pfVar13 == (float *)0x0) {
          pcVar23 = "out of memory while attempting to allocate space for derivatives\n";
          goto LAB_0018da7a;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar22);
      if (dEdfs->used != 0) {
        (*dEdfs->a->_vptr_MemAllocator[4])(dEdfs->a,dEdfs->mem);
      }
    }
    (this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].v = kSCALAR_ONE;
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
         0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_88,uVar22,(bool *)&local_58,(allocator_type *)&local_a8);
    pCVar4 = (this->super_ExecutionEngine).cg;
    pVVar6 = (pCVar4->parameter_nodes).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar14 = (pCVar4->parameter_nodes).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start; pVVar14 != pVVar6;
        pVVar14 = pVVar14 + 1) {
      local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[pVVar14->t >> 6] =
           local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[pVVar14->t >> 6] | 1L << ((byte)pVVar14->t & 0x3f)
      ;
    }
    if (uVar19 + 1 != 0) {
      ppNVar7 = (pCVar4->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar20 = 0;
      do {
        uVar24 = 1L << ((byte)uVar20 & 0x3f);
        uVar17 = uVar20 >> 6 & 0x3ffffff;
        uVar21 = local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar17];
        bVar26 = (uVar21 >> (uVar20 & 0x3f) & 1) != 0;
        pNVar8 = ppNVar7[uVar20];
        for (pVVar14 = *(pointer *)
                        &(pNVar8->args).
                         super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                         ._M_impl;
            pVVar14 !=
            (pNVar8->args).
            super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
            super__Vector_impl_data._M_finish; pVVar14 = pVVar14 + 1) {
          bVar26 = (bool)(bVar26 | (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                    [pVVar14->t >> 6] >> ((ulong)pVVar14->t & 0x3f) & 1) != 0);
        }
        uVar25 = uVar21 | uVar24;
        if (!bVar26) {
          uVar25 = ~uVar24 & uVar21;
        }
        local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar17] = uVar25;
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar22);
    }
    local_a8.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_a8.
                          super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_58,uVar22,(bool *)&local_a8,&local_b1);
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[uVar19 >> 6] =
         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] | 1L << ((byte)uVar19 & 0x3f);
    local_a8.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (-1 < (int)uVar19) {
      do {
        local_b0 = uVar18;
        if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar18 >> 6 & 0x3ffffff] >> (uVar18 & 0x3f) & 1)
            != 0) {
          pNVar8 = (((this->super_ExecutionEngine).cg)->nodes).
                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
          std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::resize
                    (&local_a8,
                     (ulong)((long)(pNVar8->args).
                                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pNVar8->args).
                                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
          uVar18 = local_b0;
          pVVar14 = (pNVar8->args).
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pVVar6 = (pNVar8->args).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pVVar14 != pVVar6) {
            uVar22 = 0;
            do {
              uVar19 = pVVar14->t;
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] |
                   1L << ((byte)uVar19 & 0x3f);
              local_a8.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar22] =
                   (this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar19;
              uVar22 = (ulong)((int)uVar22 + 1);
              pVVar14 = pVVar14 + 1;
            } while (pVVar14 != pVVar6);
            pVVar14 = (pNVar8->args).
                      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pVVar6 = (pNVar8->args).
                     super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (pVVar14 != pVVar6) {
              uVar19 = 0;
              do {
                uVar3 = pVVar14->t;
                if ((local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] >>
                     ((ulong)uVar3 & 0x3f) & 1) != 0) {
                  pTVar16 = (this->ndEdfs).
                            super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  Node::backward(pNVar8,&local_a8,
                                 (this->nfxs).
                                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                                 _M_impl.super__Vector_impl_data._M_start + uVar18,pTVar16 + uVar18,
                                 uVar19,pTVar16 + uVar3);
                }
                uVar19 = uVar19 + 1;
                pVVar14 = pVVar14 + 1;
              } while (pVVar14 != pVVar6);
            }
          }
        }
        uVar18 = local_b0 - 1;
      } while (0 < (long)local_b0);
    }
    pCVar4 = (this->super_ExecutionEngine).cg;
    pVVar6 = (pCVar4->parameter_nodes).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar14 = (pCVar4->parameter_nodes).
                   super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                   _M_impl.super__Vector_impl_data._M_start; pVVar14 != pVVar6;
        pVVar14 = pVVar14 + 1) {
      pNVar8 = (((this->super_ExecutionEngine).cg)->nodes).
               super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start[pVVar14->t];
      (*pNVar8->_vptr_Node[10])
                (pNVar8,(this->ndEdfs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>
                        ._M_impl.super__Vector_impl_data._M_start + pVVar14->t);
    }
    if (local_a8.super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    if (local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_88.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return;
  }
  pcVar23 = "backward() called on non-scalar node.\n";
LAB_0018da7a:
  std::operator<<((ostream *)&std::cerr,pcVar23);
  abort();
}

Assistant:

void SimpleExecutionEngine::backward(VariableIndex from_where) {
  assert(from_where+1 <= nfxs.size());
  assert(from_where+1 <= cg.nodes.size());
  if (nfxs[from_where].d.size() != 1) {
    cerr << "backward() called on non-scalar node.\n";
    abort();
  }

  const unsigned num_nodes = from_where+1;
  ndEdfs.resize(num_nodes);
  dEdfs->free();
  for (unsigned i = 0; i < num_nodes; ++i) {
    const auto dim = nfxs[i].d;
    ndEdfs[i].d = dim;
    ndEdfs[i].v = static_cast<float*>(dEdfs->allocate(dim.size() * sizeof(float)));
    if (!ndEdfs[i].v) {
      cerr << "out of memory while attempting to allocate space for derivatives\n";
      abort();
    }
  }
  dEdfs->zero_allocated_memory();
  // initialize dE/dE = 1
  ndEdfs.back().v = kSCALAR_ONE;

  // here we find constant paths to avoid doing extra work
  // by default, a node is constant unless
  //   1) it is a parameter node
  //   2) it depends on a non-constant node
  // (thus, functions of constants and inputs end up being
  //  false in this computation)
  vector<bool> needs_derivative(num_nodes, false);
  for (auto i : cg.parameter_nodes)
    needs_derivative[i] = true;

  for (unsigned ni = 0; ni < num_nodes; ++ni) {
    bool nd = needs_derivative[ni];
    for (auto arg : cg.nodes[ni]->args)
      nd |= needs_derivative[arg];
    needs_derivative[ni] = nd;
  }

  // loop in reverse topological order
  // consider only nodes that participate in the computation.
  vector<bool> in_computation(num_nodes, false);
  in_computation[num_nodes - 1] = true;
  vector<const Tensor*> xs;
  for (int i = num_nodes - 1; i >= 0; --i) {
    if (!in_computation[i]) continue;
    const Node* node = cg.nodes[i];
    xs.resize(node->arity());
    unsigned ai = 0;
    for (VariableIndex arg : node->args) {
      in_computation[arg] = true;
      xs[ai] = &nfxs[arg];
      ++ai;
    }
    ai = 0;
    for (VariableIndex arg : node->args) {
      if (needs_derivative[arg]) {
        node->backward(xs, nfxs[i], ndEdfs[i], ai, ndEdfs[arg]);
      }
      ++ai;
    }
  }

  // accumulate gradients into parameters
  // this is simpler than you might find in some other frameworks
  // since we assume parameters come into the graph as a "function"
  // that returns the current value of the parameters
  for (VariableIndex i : cg.parameter_nodes)
    static_cast<ParameterNodeBase*>(cg.nodes[i])->accumulate_grad(ndEdfs[i]);
}